

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicatevisitor.cpp
# Opt level: O3

void __thiscall
PredicateVisitor::visit
          (PredicateVisitor *this,Expression *parent,BinaryOperatorExpression *expression)

{
  bool bVar1;
  BinaryOperatorExpression *local_18;
  
  if (this->mHasResult == false) {
    DfsVisitor::visit(&this->super_DfsVisitor,parent,expression);
    local_18 = expression;
    if ((this->mPredicate).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    bVar1 = (*(this->mPredicate)._M_invoker)
                      ((_Any_data *)&this->mPredicate,(Expression **)&local_18);
    if (bVar1) {
      this->mHasResult = true;
    }
  }
  return;
}

Assistant:

void PredicateVisitor::visit(Expression* parent, BinaryOperatorExpression* expression) {
	if (mHasResult) {
		return;
	}

	DfsVisitor::visit(parent, expression);

	if (mPredicate(expression)) {
		mHasResult = true;
	}
}